

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_low32_avx2(__m256i *input,__m256i *output)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i _r;
  __m256i w0;
  __m256i _r_00;
  __m256i w0_00;
  __m256i _r_01;
  __m256i w0_01;
  __m256i w0_02;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  undefined4 uVar8;
  int8_t cos_bit;
  int8_t cos_bit_00;
  int8_t cos_bit_01;
  int8_t cos_bit_02;
  int8_t cos_bit_03;
  int8_t cos_bit_04;
  int32_t cos_bit_05;
  int32_t cos_bit_06;
  int32_t cos_bit_07;
  int32_t cos_bit_08;
  int32_t cos_bit_09;
  int32_t *cospi;
  __m256i *palVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  longlong lVar76;
  undefined1 in_stack_fffffffffffff680 [24];
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 uStack_928;
  undefined4 uStack_924;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  __m256i local_860;
  __m256i local_840;
  __m256i local_820;
  undefined1 local_800 [32];
  __m256i local_7e0;
  __m256i local_7c0;
  __m256i local_7a0;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  __m256i local_740;
  __m256i local_720;
  __m256i local_700;
  __m256i local_6e0;
  __m256i local_6c0;
  __m256i local_6a0;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_860 = *input;
  local_820 = input[0x10];
  local_7e0 = input[8];
  local_7a0 = input[0x18];
  uStack_914 = (undefined4)((ulong)input[10][1] >> 0x20);
  uStack_910 = (undefined4)input[10][2];
  uStack_90c = (undefined4)((ulong)input[10][2] >> 0x20);
  uStack_908 = (undefined4)input[10][3];
  uStack_904 = (undefined4)((ulong)input[10][3] >> 0x20);
  uStack_934 = (undefined4)((ulong)input[0x1a][1] >> 0x20);
  uStack_930 = (undefined4)input[0x1a][2];
  uStack_92c = (undefined4)((ulong)input[0x1a][2] >> 0x20);
  uStack_928 = (undefined4)input[0x1a][3];
  uStack_924 = (undefined4)((ulong)input[0x1a][3] >> 0x20);
  uStack_8b4 = (undefined4)((ulong)input[0xe][1] >> 0x20);
  uStack_8b0 = (undefined4)input[0xe][2];
  uStack_8ac = (undefined4)((ulong)input[0xe][2] >> 0x20);
  uStack_8a8 = (undefined4)input[0xe][3];
  uStack_8a4 = (undefined4)((ulong)input[0xe][3] >> 0x20);
  uStack_8f4 = (undefined4)((ulong)input[3][1] >> 0x20);
  uStack_8f0 = (undefined4)input[3][2];
  uStack_8ec = (undefined4)((ulong)input[3][2] >> 0x20);
  uStack_8e8 = (undefined4)input[3][3];
  uStack_8e4 = (undefined4)((ulong)input[3][3] >> 0x20);
  auVar52._8_2_ = 0x65;
  auVar52._0_8_ = 0x65006500650065;
  auVar52._10_2_ = 0x65;
  auVar52._12_2_ = 0x65;
  auVar52._14_2_ = 0x65;
  auVar52._16_2_ = 0x65;
  auVar52._18_2_ = 0x65;
  auVar52._20_2_ = 0x65;
  auVar52._22_2_ = 0x65;
  auVar52._24_2_ = 0x65;
  auVar52._26_2_ = 0x65;
  auVar52._28_2_ = 0x65;
  auVar52._30_2_ = 0x65;
  auVar53 = vpsllw_avx2(auVar52,3);
  auVar53 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar53);
  auVar54._8_2_ = 0xfff;
  auVar54._0_8_ = 0xfff0fff0fff0fff;
  auVar54._10_2_ = 0xfff;
  auVar54._12_2_ = 0xfff;
  auVar54._14_2_ = 0xfff;
  auVar54._16_2_ = 0xfff;
  auVar54._18_2_ = 0xfff;
  auVar54._20_2_ = 0xfff;
  auVar54._22_2_ = 0xfff;
  auVar54._24_2_ = 0xfff;
  auVar54._26_2_ = 0xfff;
  auVar54._28_2_ = 0xfff;
  auVar54._30_2_ = 0xfff;
  auVar55 = vpsllw_avx2(auVar54,3);
  auVar55 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar55);
  auVar56._8_2_ = 0xa7c0;
  auVar56._0_8_ = 0xa7c0a7c0a7c0a7c0;
  auVar56._10_2_ = 0xa7c0;
  auVar56._12_2_ = 0xa7c0;
  auVar56._14_2_ = 0xa7c0;
  auVar56._16_2_ = 0xa7c0;
  auVar56._18_2_ = 0xa7c0;
  auVar56._20_2_ = 0xa7c0;
  auVar56._22_2_ = 0xa7c0;
  auVar56._24_2_ = 0xa7c0;
  auVar56._26_2_ = 0xa7c0;
  auVar56._28_2_ = 0xa7c0;
  auVar56._30_2_ = 0xa7c0;
  auVar51 = vpmulhrsw_avx2((undefined1  [32])input[0x1f],auVar56);
  auVar57._8_2_ = 0xb97;
  auVar57._0_8_ = 0xb970b970b970b97;
  auVar57._10_2_ = 0xb97;
  auVar57._12_2_ = 0xb97;
  auVar57._14_2_ = 0xb97;
  auVar57._16_2_ = 0xb97;
  auVar57._18_2_ = 0xb97;
  auVar57._20_2_ = 0xb97;
  auVar57._22_2_ = 0xb97;
  auVar57._24_2_ = 0xb97;
  auVar57._26_2_ = 0xb97;
  auVar57._28_2_ = 0xb97;
  auVar57._30_2_ = 0xb97;
  auVar58 = vpsllw_avx2(auVar57,3);
  auVar58 = vpmulhrsw_avx2((undefined1  [32])input[0x1f],auVar58);
  auVar10._8_2_ = 0x67c;
  auVar10._0_8_ = 0x67c067c067c067c;
  auVar10._10_2_ = 0x67c;
  auVar10._12_2_ = 0x67c;
  auVar10._14_2_ = 0x67c;
  auVar10._16_2_ = 0x67c;
  auVar10._18_2_ = 0x67c;
  auVar10._20_2_ = 0x67c;
  auVar10._22_2_ = 0x67c;
  auVar10._24_2_ = 0x67c;
  auVar10._26_2_ = 0x67c;
  auVar10._28_2_ = 0x67c;
  auVar10._30_2_ = 0x67c;
  auVar10 = vpsllw_avx2(auVar10,3);
  auVar10 = vpmulhrsw_avx2((undefined1  [32])input[0x11],auVar10);
  auVar11._8_2_ = 0xea1;
  auVar11._0_8_ = 0xea10ea10ea10ea1;
  auVar11._10_2_ = 0xea1;
  auVar11._12_2_ = 0xea1;
  auVar11._14_2_ = 0xea1;
  auVar11._16_2_ = 0xea1;
  auVar11._18_2_ = 0xea1;
  auVar11._20_2_ = 0xea1;
  auVar11._22_2_ = 0xea1;
  auVar11._24_2_ = 0xea1;
  auVar11._26_2_ = 0xea1;
  auVar11._28_2_ = 0xea1;
  auVar11._30_2_ = 0xea1;
  auVar11 = vpsllw_avx2(auVar11,3);
  auVar11 = vpmulhrsw_avx2((undefined1  [32])input[0x11],auVar11);
  auVar12._8_2_ = 0xd1f0;
  auVar12._0_8_ = 0xd1f0d1f0d1f0d1f0;
  auVar12._10_2_ = 0xd1f0;
  auVar12._12_2_ = 0xd1f0;
  auVar12._14_2_ = 0xd1f0;
  auVar12._16_2_ = 0xd1f0;
  auVar12._18_2_ = 0xd1f0;
  auVar12._20_2_ = 0xd1f0;
  auVar12._22_2_ = 0xd1f0;
  auVar12._24_2_ = 0xd1f0;
  auVar12._26_2_ = 0xd1f0;
  auVar12._28_2_ = 0xd1f0;
  auVar12._30_2_ = 0xd1f0;
  auVar12 = vpmulhrsw_avx2((undefined1  [32])input[0xf],auVar12);
  auVar13._8_2_ = 0xeee;
  auVar13._0_8_ = 0xeee0eee0eee0eee;
  auVar13._10_2_ = 0xeee;
  auVar13._12_2_ = 0xeee;
  auVar13._14_2_ = 0xeee;
  auVar13._16_2_ = 0xeee;
  auVar13._18_2_ = 0xeee;
  auVar13._20_2_ = 0xeee;
  auVar13._22_2_ = 0xeee;
  auVar13._24_2_ = 0xeee;
  auVar13._26_2_ = 0xeee;
  auVar13._28_2_ = 0xeee;
  auVar13._30_2_ = 0xeee;
  auVar13 = vpsllw_avx2(auVar13,3);
  auVar13 = vpmulhrsw_avx2((undefined1  [32])input[0xf],auVar13);
  auVar59._8_2_ = 0x381;
  auVar59._0_8_ = 0x381038103810381;
  auVar59._10_2_ = 0x381;
  auVar59._12_2_ = 0x381;
  auVar59._14_2_ = 0x381;
  auVar59._16_2_ = 0x381;
  auVar59._18_2_ = 0x381;
  auVar59._20_2_ = 0x381;
  auVar59._22_2_ = 0x381;
  auVar59._24_2_ = 0x381;
  auVar59._26_2_ = 0x381;
  auVar59._28_2_ = 0x381;
  auVar59._30_2_ = 0x381;
  auVar14 = vpsllw_avx2(auVar59,3);
  auVar14 = vpmulhrsw_avx2((undefined1  [32])input[9],auVar14);
  auVar15._8_2_ = 0xf9c;
  auVar15._0_8_ = 0xf9c0f9c0f9c0f9c;
  auVar15._10_2_ = 0xf9c;
  auVar15._12_2_ = 0xf9c;
  auVar15._14_2_ = 0xf9c;
  auVar15._16_2_ = 0xf9c;
  auVar15._18_2_ = 0xf9c;
  auVar15._20_2_ = 0xf9c;
  auVar15._22_2_ = 0xf9c;
  auVar15._24_2_ = 0xf9c;
  auVar15._26_2_ = 0xf9c;
  auVar15._28_2_ = 0xf9c;
  auVar15._30_2_ = 0xf9c;
  auVar15 = vpsllw_avx2(auVar15,3);
  auVar15 = vpmulhrsw_avx2((undefined1  [32])input[9],auVar15);
  auVar16._8_2_ = 0xbb88;
  auVar16._0_8_ = 0xbb88bb88bb88bb88;
  auVar16._10_2_ = 0xbb88;
  auVar16._12_2_ = 0xbb88;
  auVar16._14_2_ = 0xbb88;
  auVar16._16_2_ = 0xbb88;
  auVar16._18_2_ = 0xbb88;
  auVar16._20_2_ = 0xbb88;
  auVar16._22_2_ = 0xbb88;
  auVar16._24_2_ = 0xbb88;
  auVar16._26_2_ = 0xbb88;
  auVar16._28_2_ = 0xbb88;
  auVar16._30_2_ = 0xbb88;
  auVar16 = vpmulhrsw_avx2((undefined1  [32])input[0x17],auVar16);
  auVar17._8_2_ = 0xd85;
  auVar17._0_8_ = 0xd850d850d850d85;
  auVar17._10_2_ = 0xd85;
  auVar17._12_2_ = 0xd85;
  auVar17._14_2_ = 0xd85;
  auVar17._16_2_ = 0xd85;
  auVar17._18_2_ = 0xd85;
  auVar17._20_2_ = 0xd85;
  auVar17._22_2_ = 0xd85;
  auVar17._24_2_ = 0xd85;
  auVar17._26_2_ = 0xd85;
  auVar17._28_2_ = 0xd85;
  auVar17._30_2_ = 0xd85;
  auVar17 = vpsllw_avx2(auVar17,3);
  auVar17 = vpmulhrsw_avx2((undefined1  [32])input[0x17],auVar17);
  auVar18._8_2_ = 0x937;
  auVar18._0_8_ = 0x937093709370937;
  auVar18._10_2_ = 0x937;
  auVar18._12_2_ = 0x937;
  auVar18._14_2_ = 0x937;
  auVar18._16_2_ = 0x937;
  auVar18._18_2_ = 0x937;
  auVar18._20_2_ = 0x937;
  auVar18._22_2_ = 0x937;
  auVar18._24_2_ = 0x937;
  auVar18._26_2_ = 0x937;
  auVar18._28_2_ = 0x937;
  auVar18._30_2_ = 0x937;
  auVar18 = vpsllw_avx2(auVar18,3);
  auVar18 = vpmulhrsw_avx2((undefined1  [32])input[0x19],auVar18);
  auVar19._8_2_ = 0xd15;
  auVar19._0_8_ = 0xd150d150d150d15;
  auVar19._10_2_ = 0xd15;
  auVar19._12_2_ = 0xd15;
  auVar19._14_2_ = 0xd15;
  auVar19._16_2_ = 0xd15;
  auVar19._18_2_ = 0xd15;
  auVar19._20_2_ = 0xd15;
  auVar19._22_2_ = 0xd15;
  auVar19._24_2_ = 0xd15;
  auVar19._26_2_ = 0xd15;
  auVar19._28_2_ = 0xd15;
  auVar19._30_2_ = 0xd15;
  auVar19 = vpsllw_avx2(auVar19,3);
  auVar19 = vpmulhrsw_avx2((undefined1  [32])input[0x19],auVar19);
  auVar20._8_2_ = 0xea20;
  auVar20._0_8_ = 0xea20ea20ea20ea20;
  auVar20._10_2_ = 0xea20;
  auVar20._12_2_ = 0xea20;
  auVar20._14_2_ = 0xea20;
  auVar20._16_2_ = 0xea20;
  auVar20._18_2_ = 0xea20;
  auVar20._20_2_ = 0xea20;
  auVar20._22_2_ = 0xea20;
  auVar20._24_2_ = 0xea20;
  auVar20._26_2_ = 0xea20;
  auVar20._28_2_ = 0xea20;
  auVar20._30_2_ = 0xea20;
  auVar20 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar20);
  auVar21._8_2_ = 0xfc4;
  auVar21._0_8_ = 0xfc40fc40fc40fc4;
  auVar21._10_2_ = 0xfc4;
  auVar21._12_2_ = 0xfc4;
  auVar21._14_2_ = 0xfc4;
  auVar21._16_2_ = 0xfc4;
  auVar21._18_2_ = 0xfc4;
  auVar21._20_2_ = 0xfc4;
  auVar21._22_2_ = 0xfc4;
  auVar21._24_2_ = 0xfc4;
  auVar21._26_2_ = 0xfc4;
  auVar21._28_2_ = 0xfc4;
  auVar21._30_2_ = 0xfc4;
  auVar21 = vpsllw_avx2(auVar21,3);
  auVar21 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar21);
  auVar60._8_2_ = 0x1f5;
  auVar60._0_8_ = 0x1f501f501f501f5;
  auVar60._10_2_ = 0x1f5;
  auVar60._12_2_ = 0x1f5;
  auVar60._14_2_ = 0x1f5;
  auVar60._16_2_ = 0x1f5;
  auVar60._18_2_ = 0x1f5;
  auVar60._20_2_ = 0x1f5;
  auVar60._22_2_ = 0x1f5;
  auVar60._24_2_ = 0x1f5;
  auVar60._26_2_ = 0x1f5;
  auVar60._28_2_ = 0x1f5;
  auVar60._30_2_ = 0x1f5;
  auVar22 = vpsllw_avx2(auVar60,3);
  auVar22 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar22);
  auVar23._8_2_ = 0xfe1;
  auVar23._0_8_ = 0xfe10fe10fe10fe1;
  auVar23._10_2_ = 0xfe1;
  auVar23._12_2_ = 0xfe1;
  auVar23._14_2_ = 0xfe1;
  auVar23._16_2_ = 0xfe1;
  auVar23._18_2_ = 0xfe1;
  auVar23._20_2_ = 0xfe1;
  auVar23._22_2_ = 0xfe1;
  auVar23._24_2_ = 0xfe1;
  auVar23._26_2_ = 0xfe1;
  auVar23._28_2_ = 0xfe1;
  auVar23._30_2_ = 0xfe1;
  auVar23 = vpsllw_avx2(auVar23,3);
  auVar23 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar23);
  auVar24._8_2_ = 0xb140;
  auVar24._0_8_ = 0xb140b140b140b140;
  auVar24._10_2_ = 0xb140;
  auVar24._12_2_ = 0xb140;
  auVar24._14_2_ = 0xb140;
  auVar24._16_2_ = 0xb140;
  auVar24._18_2_ = 0xb140;
  auVar24._20_2_ = 0xb140;
  auVar24._22_2_ = 0xb140;
  auVar24._24_2_ = 0xb140;
  auVar24._26_2_ = 0xb140;
  auVar24._28_2_ = 0xb140;
  auVar24._30_2_ = 0xb140;
  auVar24 = vpmulhrsw_avx2((undefined1  [32])input[0x1b],auVar24);
  auVar25._8_2_ = 0xc9d;
  auVar25._0_8_ = 0xc9d0c9d0c9d0c9d;
  auVar25._10_2_ = 0xc9d;
  auVar25._12_2_ = 0xc9d;
  auVar25._14_2_ = 0xc9d;
  auVar25._16_2_ = 0xc9d;
  auVar25._18_2_ = 0xc9d;
  auVar25._20_2_ = 0xc9d;
  auVar25._22_2_ = 0xc9d;
  auVar25._24_2_ = 0xc9d;
  auVar25._26_2_ = 0xc9d;
  auVar25._28_2_ = 0xc9d;
  auVar25._30_2_ = 0xc9d;
  auVar25 = vpsllw_avx2(auVar25,3);
  auVar25 = vpmulhrsw_avx2((undefined1  [32])input[0x1b],auVar25);
  auVar26._8_2_ = 0x7e3;
  auVar26._0_8_ = 0x7e307e307e307e3;
  auVar26._10_2_ = 0x7e3;
  auVar26._12_2_ = 0x7e3;
  auVar26._14_2_ = 0x7e3;
  auVar26._16_2_ = 0x7e3;
  auVar26._18_2_ = 0x7e3;
  auVar26._20_2_ = 0x7e3;
  auVar26._22_2_ = 0x7e3;
  auVar26._24_2_ = 0x7e3;
  auVar26._26_2_ = 0x7e3;
  auVar26._28_2_ = 0x7e3;
  auVar26._30_2_ = 0x7e3;
  auVar26 = vpsllw_avx2(auVar26,3);
  auVar26 = vpmulhrsw_avx2((undefined1  [32])input[0x15],auVar26);
  auVar27._8_2_ = 0xdec;
  auVar27._0_8_ = 0xdec0dec0dec0dec;
  auVar27._10_2_ = 0xdec;
  auVar27._12_2_ = 0xdec;
  auVar27._14_2_ = 0xdec;
  auVar27._16_2_ = 0xdec;
  auVar27._18_2_ = 0xdec;
  auVar27._20_2_ = 0xdec;
  auVar27._22_2_ = 0xdec;
  auVar27._24_2_ = 0xdec;
  auVar27._26_2_ = 0xdec;
  auVar27._28_2_ = 0xdec;
  auVar27._30_2_ = 0xdec;
  auVar27 = vpsllw_avx2(auVar27,3);
  auVar27 = vpmulhrsw_avx2((undefined1  [32])input[0x15],auVar27);
  auVar28._8_2_ = 0xdde0;
  auVar28._0_8_ = 0xdde0dde0dde0dde0;
  auVar28._10_2_ = 0xdde0;
  auVar28._12_2_ = 0xdde0;
  auVar28._14_2_ = 0xdde0;
  auVar28._16_2_ = 0xdde0;
  auVar28._18_2_ = 0xdde0;
  auVar28._20_2_ = 0xdde0;
  auVar28._22_2_ = 0xdde0;
  auVar28._24_2_ = 0xdde0;
  auVar28._26_2_ = 0xdde0;
  auVar28._28_2_ = 0xdde0;
  auVar28._30_2_ = 0xdde0;
  auVar28 = vpmulhrsw_avx2((undefined1  [32])input[0xb],auVar28);
  auVar29._8_2_ = 0xf6c;
  auVar29._0_8_ = 0xf6c0f6c0f6c0f6c;
  auVar29._10_2_ = 0xf6c;
  auVar29._12_2_ = 0xf6c;
  auVar29._14_2_ = 0xf6c;
  auVar29._16_2_ = 0xf6c;
  auVar29._18_2_ = 0xf6c;
  auVar29._20_2_ = 0xf6c;
  auVar29._22_2_ = 0xf6c;
  auVar29._24_2_ = 0xf6c;
  auVar29._26_2_ = 0xf6c;
  auVar29._28_2_ = 0xf6c;
  auVar29._30_2_ = 0xf6c;
  auVar29 = vpsllw_avx2(auVar29,3);
  auVar29 = vpmulhrsw_avx2((undefined1  [32])input[0xb],auVar29);
  auVar61._8_2_ = 0x505;
  auVar61._0_8_ = 0x505050505050505;
  auVar61._10_2_ = 0x505;
  auVar61._12_2_ = 0x505;
  auVar61._14_2_ = 0x505;
  auVar61._16_2_ = 0x505;
  auVar61._18_2_ = 0x505;
  auVar61._20_2_ = 0x505;
  auVar61._22_2_ = 0x505;
  auVar61._24_2_ = 0x505;
  auVar61._26_2_ = 0x505;
  auVar61._28_2_ = 0x505;
  auVar61._30_2_ = 0x505;
  auVar30 = vpsllw_avx2(auVar61,3);
  auVar30 = vpmulhrsw_avx2((undefined1  [32])input[0xd],auVar30);
  auVar31._8_2_ = 0xf31;
  auVar31._0_8_ = 0xf310f310f310f31;
  auVar31._10_2_ = 0xf31;
  auVar31._12_2_ = 0xf31;
  auVar31._14_2_ = 0xf31;
  auVar31._16_2_ = 0xf31;
  auVar31._18_2_ = 0xf31;
  auVar31._20_2_ = 0xf31;
  auVar31._22_2_ = 0xf31;
  auVar31._24_2_ = 0xf31;
  auVar31._26_2_ = 0xf31;
  auVar31._28_2_ = 0xf31;
  auVar31._30_2_ = 0xf31;
  auVar31 = vpsllw_avx2(auVar31,3);
  auVar31 = vpmulhrsw_avx2((undefined1  [32])input[0xd],auVar31);
  auVar32._8_2_ = 0xc670;
  auVar32._0_8_ = 0xc670c670c670c670;
  auVar32._10_2_ = 0xc670;
  auVar32._12_2_ = 0xc670;
  auVar32._14_2_ = 0xc670;
  auVar32._16_2_ = 0xc670;
  auVar32._18_2_ = 0xc670;
  auVar32._20_2_ = 0xc670;
  auVar32._22_2_ = 0xc670;
  auVar32._24_2_ = 0xc670;
  auVar32._26_2_ = 0xc670;
  auVar32._28_2_ = 0xc670;
  auVar32._30_2_ = 0xc670;
  auVar32 = vpmulhrsw_avx2((undefined1  [32])input[0x13],auVar32);
  auVar33._8_2_ = 0xe4b;
  auVar33._0_8_ = 0xe4b0e4b0e4b0e4b;
  auVar33._10_2_ = 0xe4b;
  auVar33._12_2_ = 0xe4b;
  auVar33._14_2_ = 0xe4b;
  auVar33._16_2_ = 0xe4b;
  auVar33._18_2_ = 0xe4b;
  auVar33._20_2_ = 0xe4b;
  auVar33._22_2_ = 0xe4b;
  auVar33._24_2_ = 0xe4b;
  auVar33._26_2_ = 0xe4b;
  auVar33._28_2_ = 0xe4b;
  auVar33._30_2_ = 0xe4b;
  auVar33 = vpsllw_avx2(auVar33,3);
  auVar33 = vpmulhrsw_avx2((undefined1  [32])input[0x13],auVar33);
  auVar34._8_2_ = 0xa73;
  auVar34._0_8_ = 0xa730a730a730a73;
  auVar34._10_2_ = 0xa73;
  auVar34._12_2_ = 0xa73;
  auVar34._14_2_ = 0xa73;
  auVar34._16_2_ = 0xa73;
  auVar34._18_2_ = 0xa73;
  auVar34._20_2_ = 0xa73;
  auVar34._22_2_ = 0xa73;
  auVar34._24_2_ = 0xa73;
  auVar34._26_2_ = 0xa73;
  auVar34._28_2_ = 0xa73;
  auVar34._30_2_ = 0xa73;
  auVar34 = vpsllw_avx2(auVar34,3);
  auVar34 = vpmulhrsw_avx2((undefined1  [32])input[0x1d],auVar34);
  auVar35._8_2_ = 0xc1e;
  auVar35._0_8_ = 0xc1e0c1e0c1e0c1e;
  auVar35._10_2_ = 0xc1e;
  auVar35._12_2_ = 0xc1e;
  auVar35._14_2_ = 0xc1e;
  auVar35._16_2_ = 0xc1e;
  auVar35._18_2_ = 0xc1e;
  auVar35._20_2_ = 0xc1e;
  auVar35._22_2_ = 0xc1e;
  auVar35._24_2_ = 0xc1e;
  auVar35._26_2_ = 0xc1e;
  auVar35._28_2_ = 0xc1e;
  auVar35._30_2_ = 0xc1e;
  auVar35 = vpsllw_avx2(auVar35,3);
  auVar35 = vpmulhrsw_avx2((undefined1  [32])input[0x1d],auVar35);
  auVar36._8_2_ = 0xf698;
  auVar36._0_8_ = 0xf698f698f698f698;
  auVar36._10_2_ = 0xf698;
  auVar36._12_2_ = 0xf698;
  auVar36._14_2_ = 0xf698;
  auVar36._16_2_ = 0xf698;
  auVar36._18_2_ = 0xf698;
  auVar36._20_2_ = 0xf698;
  auVar36._22_2_ = 0xf698;
  auVar36._24_2_ = 0xf698;
  auVar36._26_2_ = 0xf698;
  auVar36._28_2_ = 0xf698;
  auVar36._30_2_ = 0xf698;
  auVar3._12_4_ = uStack_8f4;
  auVar3._0_12_ = *(undefined1 (*) [12])input[3];
  auVar3._16_4_ = uStack_8f0;
  auVar3._20_4_ = uStack_8ec;
  auVar3._24_4_ = uStack_8e8;
  auVar3._28_4_ = uStack_8e4;
  auVar36 = vpmulhrsw_avx2(auVar3,auVar36);
  auVar37._8_2_ = 0xff5;
  auVar37._0_8_ = 0xff50ff50ff50ff5;
  auVar37._10_2_ = 0xff5;
  auVar37._12_2_ = 0xff5;
  auVar37._14_2_ = 0xff5;
  auVar37._16_2_ = 0xff5;
  auVar37._18_2_ = 0xff5;
  auVar37._20_2_ = 0xff5;
  auVar37._22_2_ = 0xff5;
  auVar37._24_2_ = 0xff5;
  auVar37._26_2_ = 0xff5;
  auVar37._28_2_ = 0xff5;
  auVar37._30_2_ = 0xff5;
  auVar37 = vpsllw_avx2(auVar37,3);
  auVar3 = vpmulhrsw_avx2(auVar3,auVar37);
  auVar62._8_2_ = 0xc9;
  auVar62._0_8_ = 0xc900c900c900c9;
  auVar62._10_2_ = 0xc9;
  auVar62._12_2_ = 0xc9;
  auVar62._14_2_ = 0xc9;
  auVar62._16_2_ = 0xc9;
  auVar62._18_2_ = 0xc9;
  auVar62._20_2_ = 0xc9;
  auVar62._22_2_ = 0xc9;
  auVar62._24_2_ = 0xc9;
  auVar62._26_2_ = 0xc9;
  auVar62._28_2_ = 0xc9;
  auVar62._30_2_ = 0xc9;
  auVar37 = vpsllw_avx2(auVar62,3);
  auVar37 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar37);
  auVar38._8_2_ = 0xffb;
  auVar38._0_8_ = 0xffb0ffb0ffb0ffb;
  auVar38._10_2_ = 0xffb;
  auVar38._12_2_ = 0xffb;
  auVar38._14_2_ = 0xffb;
  auVar38._16_2_ = 0xffb;
  auVar38._18_2_ = 0xffb;
  auVar38._20_2_ = 0xffb;
  auVar38._22_2_ = 0xffb;
  auVar38._24_2_ = 0xffb;
  auVar38._26_2_ = 0xffb;
  auVar38._28_2_ = 0xffb;
  auVar38._30_2_ = 0xffb;
  auVar38 = vpsllw_avx2(auVar38,3);
  auVar38 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar38);
  auVar39._8_2_ = 0xaa08;
  auVar39._0_8_ = 0xaa08aa08aa08aa08;
  auVar39._10_2_ = 0xaa08;
  auVar39._12_2_ = 0xaa08;
  auVar39._14_2_ = 0xaa08;
  auVar39._16_2_ = 0xaa08;
  auVar39._18_2_ = 0xaa08;
  auVar39._20_2_ = 0xaa08;
  auVar39._22_2_ = 0xaa08;
  auVar39._24_2_ = 0xaa08;
  auVar39._26_2_ = 0xaa08;
  auVar39._28_2_ = 0xaa08;
  auVar39._30_2_ = 0xaa08;
  auVar39 = vpmulhrsw_avx2((undefined1  [32])input[0x1e],auVar39);
  auVar40._8_2_ = 0xbdb;
  auVar40._0_8_ = 0xbdb0bdb0bdb0bdb;
  auVar40._10_2_ = 0xbdb;
  auVar40._12_2_ = 0xbdb;
  auVar40._14_2_ = 0xbdb;
  auVar40._16_2_ = 0xbdb;
  auVar40._18_2_ = 0xbdb;
  auVar40._20_2_ = 0xbdb;
  auVar40._22_2_ = 0xbdb;
  auVar40._24_2_ = 0xbdb;
  auVar40._26_2_ = 0xbdb;
  auVar40._28_2_ = 0xbdb;
  auVar40._30_2_ = 0xbdb;
  auVar40 = vpsllw_avx2(auVar40,3);
  auVar40 = vpmulhrsw_avx2((undefined1  [32])input[0x1e],auVar40);
  auVar41._8_2_ = 0x6d7;
  auVar41._0_8_ = 0x6d706d706d706d7;
  auVar41._10_2_ = 0x6d7;
  auVar41._12_2_ = 0x6d7;
  auVar41._14_2_ = 0x6d7;
  auVar41._16_2_ = 0x6d7;
  auVar41._18_2_ = 0x6d7;
  auVar41._20_2_ = 0x6d7;
  auVar41._22_2_ = 0x6d7;
  auVar41._24_2_ = 0x6d7;
  auVar41._26_2_ = 0x6d7;
  auVar41._28_2_ = 0x6d7;
  auVar41._30_2_ = 0x6d7;
  auVar41 = vpsllw_avx2(auVar41,3);
  auVar41 = vpmulhrsw_avx2((undefined1  [32])input[0x12],auVar41);
  auVar42._8_2_ = 0xe77;
  auVar42._0_8_ = 0xe770e770e770e77;
  auVar42._10_2_ = 0xe77;
  auVar42._12_2_ = 0xe77;
  auVar42._14_2_ = 0xe77;
  auVar42._16_2_ = 0xe77;
  auVar42._18_2_ = 0xe77;
  auVar42._20_2_ = 0xe77;
  auVar42._22_2_ = 0xe77;
  auVar42._24_2_ = 0xe77;
  auVar42._26_2_ = 0xe77;
  auVar42._28_2_ = 0xe77;
  auVar42._30_2_ = 0xe77;
  auVar42 = vpsllw_avx2(auVar42,3);
  auVar42 = vpmulhrsw_avx2((undefined1  [32])input[0x12],auVar42);
  auVar43._8_2_ = 0xd4e0;
  auVar43._0_8_ = 0xd4e0d4e0d4e0d4e0;
  auVar43._10_2_ = 0xd4e0;
  auVar43._12_2_ = 0xd4e0;
  auVar43._14_2_ = 0xd4e0;
  auVar43._16_2_ = 0xd4e0;
  auVar43._18_2_ = 0xd4e0;
  auVar43._20_2_ = 0xd4e0;
  auVar43._22_2_ = 0xd4e0;
  auVar43._24_2_ = 0xd4e0;
  auVar43._26_2_ = 0xd4e0;
  auVar43._28_2_ = 0xd4e0;
  auVar43._30_2_ = 0xd4e0;
  auVar4._12_4_ = uStack_8b4;
  auVar4._0_12_ = *(undefined1 (*) [12])input[0xe];
  auVar4._16_4_ = uStack_8b0;
  auVar4._20_4_ = uStack_8ac;
  auVar4._24_4_ = uStack_8a8;
  auVar4._28_4_ = uStack_8a4;
  auVar43 = vpmulhrsw_avx2(auVar4,auVar43);
  auVar44._8_2_ = 0xf11;
  auVar44._0_8_ = 0xf110f110f110f11;
  auVar44._10_2_ = 0xf11;
  auVar44._12_2_ = 0xf11;
  auVar44._14_2_ = 0xf11;
  auVar44._16_2_ = 0xf11;
  auVar44._18_2_ = 0xf11;
  auVar44._20_2_ = 0xf11;
  auVar44._22_2_ = 0xf11;
  auVar44._24_2_ = 0xf11;
  auVar44._26_2_ = 0xf11;
  auVar44._28_2_ = 0xf11;
  auVar44._30_2_ = 0xf11;
  auVar44 = vpsllw_avx2(auVar44,3);
  auVar4 = vpmulhrsw_avx2(auVar4,auVar44);
  auVar45._8_2_ = 0x3e3;
  auVar45._0_8_ = 0x3e303e303e303e3;
  auVar45._10_2_ = 0x3e3;
  auVar45._12_2_ = 0x3e3;
  auVar45._14_2_ = 0x3e3;
  auVar45._16_2_ = 0x3e3;
  auVar45._18_2_ = 0x3e3;
  auVar45._20_2_ = 0x3e3;
  auVar45._22_2_ = 0x3e3;
  auVar45._24_2_ = 0x3e3;
  auVar45._26_2_ = 0x3e3;
  auVar45._28_2_ = 0x3e3;
  auVar45._30_2_ = 0x3e3;
  auVar44 = vpsllw_avx2(auVar45,3);
  auVar5._12_4_ = uStack_914;
  auVar5._0_12_ = *(undefined1 (*) [12])input[10];
  auVar5._16_4_ = uStack_910;
  auVar5._20_4_ = uStack_90c;
  auVar5._24_4_ = uStack_908;
  auVar5._28_4_ = uStack_904;
  auVar44 = vpmulhrsw_avx2(auVar5,auVar44);
  auVar46._8_2_ = 0xf85;
  auVar46._0_8_ = 0xf850f850f850f85;
  auVar46._10_2_ = 0xf85;
  auVar46._12_2_ = 0xf85;
  auVar46._14_2_ = 0xf85;
  auVar46._16_2_ = 0xf85;
  auVar46._18_2_ = 0xf85;
  auVar46._20_2_ = 0xf85;
  auVar46._22_2_ = 0xf85;
  auVar46._24_2_ = 0xf85;
  auVar46._26_2_ = 0xf85;
  auVar46._28_2_ = 0xf85;
  auVar46._30_2_ = 0xf85;
  auVar45 = vpsllw_avx2(auVar46,3);
  auVar5 = vpmulhrsw_avx2(auVar5,auVar45);
  auVar49._8_2_ = 0xbe30;
  auVar49._0_8_ = 0xbe30be30be30be30;
  auVar49._10_2_ = 0xbe30;
  auVar49._12_2_ = 0xbe30;
  auVar49._14_2_ = 0xbe30;
  auVar49._16_2_ = 0xbe30;
  auVar49._18_2_ = 0xbe30;
  auVar49._20_2_ = 0xbe30;
  auVar49._22_2_ = 0xbe30;
  auVar49._24_2_ = 0xbe30;
  auVar49._26_2_ = 0xbe30;
  auVar49._28_2_ = 0xbe30;
  auVar49._30_2_ = 0xbe30;
  auVar6._12_4_ = (int)((ulong)input[0x16][1] >> 0x20);
  auVar6._0_12_ = *(undefined1 (*) [12])input[0x16];
  auVar6._16_4_ = (int)input[0x16][2];
  auVar6._20_4_ = (int)((ulong)input[0x16][2] >> 0x20);
  auVar6._24_4_ = (int)input[0x16][3];
  auVar6._28_4_ = (int)((ulong)input[0x16][3] >> 0x20);
  auVar45 = vpmulhrsw_avx2(auVar6,auVar49);
  auVar64._8_2_ = 0xdb9;
  auVar64._0_8_ = 0xdb90db90db90db9;
  auVar64._10_2_ = 0xdb9;
  auVar64._12_2_ = 0xdb9;
  auVar64._14_2_ = 0xdb9;
  auVar64._16_2_ = 0xdb9;
  auVar64._18_2_ = 0xdb9;
  auVar64._20_2_ = 0xdb9;
  auVar64._22_2_ = 0xdb9;
  auVar64._24_2_ = 0xdb9;
  auVar64._26_2_ = 0xdb9;
  auVar64._28_2_ = 0xdb9;
  auVar64._30_2_ = 0xdb9;
  cospi = (int32_t *)0xf138f9e1;
  auVar46 = vpsllw_avx2(auVar64,3);
  auVar6 = vpmulhrsw_avx2(auVar6,auVar46);
  uVar8 = 0xb50f4b0;
  auVar47._8_2_ = 0x988;
  auVar47._0_8_ = 0x988098809880988;
  auVar47._10_2_ = 0x988;
  auVar47._12_2_ = 0x988;
  auVar47._14_2_ = 0x988;
  auVar47._16_2_ = 0x988;
  auVar47._18_2_ = 0x988;
  auVar47._20_2_ = 0x988;
  auVar47._22_2_ = 0x988;
  auVar47._24_2_ = 0x988;
  auVar47._26_2_ = 0x988;
  auVar47._28_2_ = 0x988;
  auVar47._30_2_ = 0x988;
  auVar46 = vpsllw_avx2(auVar47,3);
  auVar7._12_4_ = uStack_934;
  auVar7._0_12_ = *(undefined1 (*) [12])input[0x1a];
  auVar7._16_4_ = uStack_930;
  auVar7._20_4_ = uStack_92c;
  auVar7._24_4_ = uStack_928;
  auVar7._28_4_ = uStack_924;
  auVar46 = vpmulhrsw_avx2(auVar7,auVar46);
  auVar48._8_2_ = 0xcda;
  auVar48._0_8_ = 0xcda0cda0cda0cda;
  auVar48._10_2_ = 0xcda;
  auVar48._12_2_ = 0xcda;
  auVar48._14_2_ = 0xcda;
  auVar48._16_2_ = 0xcda;
  auVar48._18_2_ = 0xcda;
  auVar48._20_2_ = 0xcda;
  auVar48._22_2_ = 0xcda;
  auVar48._24_2_ = 0xcda;
  auVar48._26_2_ = 0xcda;
  auVar48._28_2_ = 0xcda;
  auVar48._30_2_ = 0xcda;
  auVar49 = vpsllw_avx2(auVar48,3);
  auVar7 = vpmulhrsw_avx2(auVar7,auVar49);
  auVar50._8_2_ = 0xed38;
  auVar50._0_8_ = 0xed38ed38ed38ed38;
  auVar50._10_2_ = 0xed38;
  auVar50._12_2_ = 0xed38;
  auVar50._14_2_ = 0xed38;
  auVar50._16_2_ = 0xed38;
  auVar50._18_2_ = 0xed38;
  auVar50._20_2_ = 0xed38;
  auVar50._22_2_ = 0xed38;
  auVar50._24_2_ = 0xed38;
  auVar50._26_2_ = 0xed38;
  auVar50._28_2_ = 0xed38;
  auVar50._30_2_ = 0xed38;
  auVar63._8_2_ = 0xfd4;
  auVar63._0_8_ = 0xfd40fd40fd40fd4;
  auVar63._10_2_ = 0xfd4;
  auVar63._12_2_ = 0xfd4;
  auVar63._14_2_ = 0xfd4;
  auVar63._16_2_ = 0xfd4;
  auVar63._18_2_ = 0xfd4;
  auVar63._20_2_ = 0xfd4;
  auVar63._22_2_ = 0xfd4;
  auVar63._24_2_ = 0xfd4;
  auVar63._26_2_ = 0xfd4;
  auVar63._28_2_ = 0xfd4;
  auVar63._30_2_ = 0xfd4;
  auVar64 = vpsllw_avx2(auVar63,3);
  auVar49 = vpmulhrsw_avx2((undefined1  [32])input[6],auVar50);
  auVar64 = vpmulhrsw_avx2((undefined1  [32])input[6],auVar64);
  local_460 = vpaddsw_avx2(auVar53,auVar51);
  local_440 = vpsubsw_avx2(auVar53,auVar51);
  local_400 = vpaddsw_avx2(auVar12,auVar10);
  local_420 = vpsubsw_avx2(auVar12,auVar10);
  local_3e0 = vpaddsw_avx2(auVar14,auVar16);
  local_3c0 = vpsubsw_avx2(auVar14,auVar16);
  local_380 = vpaddsw_avx2(auVar20,auVar18);
  local_3a0 = vpsubsw_avx2(auVar20,auVar18);
  local_360 = vpaddsw_avx2(auVar22,auVar24);
  local_340 = vpsubsw_avx2(auVar22,auVar24);
  local_300 = vpaddsw_avx2(auVar28,auVar26);
  local_320 = vpsubsw_avx2(auVar28,auVar26);
  local_2e0 = vpaddsw_avx2(auVar30,auVar32);
  local_2c0 = vpsubsw_avx2(auVar30,auVar32);
  local_280 = vpaddsw_avx2(auVar36,auVar34);
  local_2a0 = vpsubsw_avx2(auVar36,auVar34);
  local_260 = vpaddsw_avx2(auVar3,auVar35);
  local_240 = vpsubsw_avx2(auVar3,auVar35);
  local_200 = vpaddsw_avx2(auVar31,auVar33);
  local_220 = vpsubsw_avx2(auVar31,auVar33);
  local_1e0 = vpaddsw_avx2(auVar29,auVar27);
  local_1c0 = vpsubsw_avx2(auVar29,auVar27);
  local_180 = vpaddsw_avx2(auVar23,auVar25);
  local_1a0 = vpsubsw_avx2(auVar23,auVar25);
  local_160 = vpaddsw_avx2(auVar21,auVar19);
  local_140 = vpsubsw_avx2(auVar21,auVar19);
  local_100 = vpaddsw_avx2(auVar15,auVar17);
  local_120 = vpsubsw_avx2(auVar15,auVar17);
  local_e0 = vpaddsw_avx2(auVar13,auVar11);
  local_c0 = vpsubsw_avx2(auVar13,auVar11);
  local_80 = vpaddsw_avx2(auVar55,auVar58);
  local_a0 = vpsubsw_avx2(auVar55,auVar58);
  auVar65._8_2_ = 0x191;
  auVar65._0_8_ = 0x191019101910191;
  auVar65._10_2_ = 0x191;
  auVar65._12_2_ = 0x191;
  auVar65._14_2_ = 0x191;
  auVar65._16_2_ = 0x191;
  auVar65._18_2_ = 0x191;
  auVar65._20_2_ = 0x191;
  auVar65._22_2_ = 0x191;
  auVar65._24_2_ = 0x191;
  auVar65._26_2_ = 0x191;
  auVar65._28_2_ = 0x191;
  auVar65._30_2_ = 0x191;
  auVar53 = vpsllw_avx2(auVar65,3);
  auVar66._8_2_ = 0xfec;
  auVar66._0_8_ = 0xfec0fec0fec0fec;
  auVar66._10_2_ = 0xfec;
  auVar66._12_2_ = 0xfec;
  auVar66._14_2_ = 0xfec;
  auVar66._16_2_ = 0xfec;
  auVar66._18_2_ = 0xfec;
  auVar66._20_2_ = 0xfec;
  auVar66._22_2_ = 0xfec;
  auVar66._24_2_ = 0xfec;
  auVar66._26_2_ = 0xfec;
  auVar66._28_2_ = 0xfec;
  auVar66._30_2_ = 0xfec;
  auVar55 = vpsllw_avx2(auVar66,3);
  local_760 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar53);
  local_680 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar55);
  auVar67._8_2_ = 0xc5e;
  auVar67._0_8_ = 0xc5e0c5e0c5e0c5e;
  auVar67._10_2_ = 0xc5e;
  auVar67._12_2_ = 0xc5e;
  auVar67._14_2_ = 0xc5e;
  auVar67._16_2_ = 0xc5e;
  auVar67._18_2_ = 0xc5e;
  auVar67._20_2_ = 0xc5e;
  auVar67._22_2_ = 0xc5e;
  auVar67._24_2_ = 0xc5e;
  auVar67._26_2_ = 0xc5e;
  auVar67._28_2_ = 0xc5e;
  auVar67._30_2_ = 0xc5e;
  auVar53._8_2_ = 0xaed0;
  auVar53._0_8_ = 0xaed0aed0aed0aed0;
  auVar53._10_2_ = 0xaed0;
  auVar53._12_2_ = 0xaed0;
  auVar53._14_2_ = 0xaed0;
  auVar53._16_2_ = 0xaed0;
  auVar53._18_2_ = 0xaed0;
  auVar53._20_2_ = 0xaed0;
  auVar53._22_2_ = 0xaed0;
  auVar53._24_2_ = 0xaed0;
  auVar53._26_2_ = 0xaed0;
  auVar53._28_2_ = 0xaed0;
  auVar53._30_2_ = 0xaed0;
  auVar55 = vpsllw_avx2(auVar67,3);
  local_740 = (__m256i)vpmulhrsw_avx2((undefined1  [32])input[0x1c],auVar53);
  local_6a0 = (__m256i)vpmulhrsw_avx2((undefined1  [32])input[0x1c],auVar55);
  auVar55._8_2_ = 0x78b;
  auVar55._0_8_ = 0x78b078b078b078b;
  auVar55._10_2_ = 0x78b;
  auVar55._12_2_ = 0x78b;
  auVar55._14_2_ = 0x78b;
  auVar55._16_2_ = 0x78b;
  auVar55._18_2_ = 0x78b;
  auVar55._20_2_ = 0x78b;
  auVar55._22_2_ = 0x78b;
  auVar55._24_2_ = 0x78b;
  auVar55._26_2_ = 0x78b;
  auVar55._28_2_ = 0x78b;
  auVar55._30_2_ = 0x78b;
  auVar68._8_2_ = 0xe1c;
  auVar68._0_8_ = 0xe1c0e1c0e1c0e1c;
  auVar68._10_2_ = 0xe1c;
  auVar68._12_2_ = 0xe1c;
  auVar68._14_2_ = 0xe1c;
  auVar68._16_2_ = 0xe1c;
  auVar68._18_2_ = 0xe1c;
  auVar68._20_2_ = 0xe1c;
  auVar68._22_2_ = 0xe1c;
  auVar68._24_2_ = 0xe1c;
  auVar68._26_2_ = 0xe1c;
  auVar68._28_2_ = 0xe1c;
  auVar68._30_2_ = 0xe1c;
  auVar53 = vpsllw_avx2(auVar55,3);
  auVar55 = vpsllw_avx2(auVar68,3);
  local_720 = (__m256i)vpmulhrsw_avx2((undefined1  [32])input[0x14],auVar53);
  local_6c0 = (__m256i)vpmulhrsw_avx2((undefined1  [32])input[0x14],auVar55);
  auVar51._8_2_ = 0xdad8;
  auVar51._0_8_ = 0xdad8dad8dad8dad8;
  auVar51._10_2_ = 0xdad8;
  auVar51._12_2_ = 0xdad8;
  auVar51._14_2_ = 0xdad8;
  auVar51._16_2_ = 0xdad8;
  auVar51._18_2_ = 0xdad8;
  auVar51._20_2_ = 0xdad8;
  auVar51._22_2_ = 0xdad8;
  auVar51._24_2_ = 0xdad8;
  auVar51._26_2_ = 0xdad8;
  auVar51._28_2_ = 0xdad8;
  auVar51._30_2_ = 0xdad8;
  auVar69._8_2_ = 0xf50;
  auVar69._0_8_ = 0xf500f500f500f50;
  auVar69._10_2_ = 0xf50;
  auVar69._12_2_ = 0xf50;
  auVar69._14_2_ = 0xf50;
  auVar69._16_2_ = 0xf50;
  auVar69._18_2_ = 0xf50;
  auVar69._20_2_ = 0xf50;
  auVar69._22_2_ = 0xf50;
  auVar69._24_2_ = 0xf50;
  auVar69._26_2_ = 0xf50;
  auVar69._28_2_ = 0xf50;
  auVar69._30_2_ = 0xf50;
  auVar53 = vpsllw_avx2(auVar69,3);
  local_700 = (__m256i)vpmulhrsw_avx2((undefined1  [32])input[0xc],auVar51);
  local_6e0 = (__m256i)vpmulhrsw_avx2((undefined1  [32])input[0xc],auVar53);
  local_660 = vpaddsw_avx2(auVar37,auVar39);
  local_640 = vpsubsw_avx2(auVar37,auVar39);
  local_600 = vpaddsw_avx2(auVar43,auVar41);
  local_620 = vpsubsw_avx2(auVar43,auVar41);
  local_5e0 = vpaddsw_avx2(auVar44,auVar45);
  local_5c0 = vpsubsw_avx2(auVar44,auVar45);
  local_580 = vpaddsw_avx2(auVar49,auVar46);
  local_5a0 = vpsubsw_avx2(auVar49,auVar46);
  local_560 = vpaddsw_avx2(auVar64,auVar7);
  local_540 = vpsubsw_avx2(auVar64,auVar7);
  local_500 = vpaddsw_avx2(auVar5,auVar6);
  local_520 = vpsubsw_avx2(auVar5,auVar6);
  local_4e0 = vpaddsw_avx2(auVar4,auVar42);
  local_4c0 = vpsubsw_avx2(auVar4,auVar42);
  local_480 = vpaddsw_avx2(auVar38,auVar40);
  local_4a0 = vpsubsw_avx2(auVar38,auVar40);
  uVar73 = 0x80000000800;
  uVar74 = 0x80000000800;
  uVar75 = 0x80000000800;
  lVar76 = 0x80000000800;
  alVar1[1] = 0x80000000800;
  alVar1[0] = 0x80000000800;
  alVar1[2] = 0x80000000800;
  alVar1[3] = 0x80000000800;
  uVar77 = uVar8;
  uVar78 = uVar8;
  uVar79 = uVar8;
  uVar80 = uVar8;
  uVar81 = uVar8;
  uVar82 = uVar8;
  uVar83 = uVar8;
  idct64_stage4_high32_avx2(&local_860,(int32_t *)0xf138f9e1,alVar1,'\0');
  auVar58._8_2_ = 799;
  auVar58._0_8_ = 0x31f031f031f031f;
  auVar58._10_2_ = 799;
  auVar58._12_2_ = 799;
  auVar58._14_2_ = 799;
  auVar58._16_2_ = 799;
  auVar58._18_2_ = 799;
  auVar58._20_2_ = 799;
  auVar58._22_2_ = 799;
  auVar58._24_2_ = 799;
  auVar58._26_2_ = 799;
  auVar58._28_2_ = 799;
  auVar58._30_2_ = 799;
  auVar53 = vpsllw_avx2(auVar58,3);
  auVar70._8_2_ = 0xfb1;
  auVar70._0_8_ = 0xfb10fb10fb10fb1;
  auVar70._10_2_ = 0xfb1;
  auVar70._12_2_ = 0xfb1;
  auVar70._14_2_ = 0xfb1;
  auVar70._16_2_ = 0xfb1;
  auVar70._18_2_ = 0xfb1;
  auVar70._20_2_ = 0xfb1;
  auVar70._22_2_ = 0xfb1;
  auVar70._24_2_ = 0xfb1;
  auVar70._26_2_ = 0xfb1;
  auVar70._28_2_ = 0xfb1;
  auVar70._30_2_ = 0xfb1;
  auVar55 = vpsllw_avx2(auVar70,3);
  auVar51 = vpmulhrsw_avx2((undefined1  [32])local_7e0,auVar53);
  local_780 = vpmulhrsw_avx2((undefined1  [32])local_7e0,auVar55);
  auVar14._8_2_ = 0xb8e0;
  auVar14._0_8_ = 0xb8e0b8e0b8e0b8e0;
  auVar14._10_2_ = 0xb8e0;
  auVar14._12_2_ = 0xb8e0;
  auVar14._14_2_ = 0xb8e0;
  auVar14._16_2_ = 0xb8e0;
  auVar14._18_2_ = 0xb8e0;
  auVar14._20_2_ = 0xb8e0;
  auVar14._22_2_ = 0xb8e0;
  auVar14._24_2_ = 0xb8e0;
  auVar14._26_2_ = 0xb8e0;
  auVar14._28_2_ = 0xb8e0;
  auVar14._30_2_ = 0xb8e0;
  auVar71._8_2_ = 0xd4e;
  auVar71._0_8_ = 0xd4e0d4e0d4e0d4e;
  auVar71._10_2_ = 0xd4e;
  auVar71._12_2_ = 0xd4e;
  auVar71._14_2_ = 0xd4e;
  auVar71._16_2_ = 0xd4e;
  auVar71._18_2_ = 0xd4e;
  auVar71._20_2_ = 0xd4e;
  auVar71._22_2_ = 0xd4e;
  auVar71._24_2_ = 0xd4e;
  auVar71._26_2_ = 0xd4e;
  auVar71._28_2_ = 0xd4e;
  auVar71._30_2_ = 0xd4e;
  auVar53 = vpsllw_avx2(auVar71,3);
  local_7c0 = (__m256i)vpmulhrsw_avx2((undefined1  [32])local_7a0,auVar14);
  local_7a0 = (__m256i)vpmulhrsw_avx2((undefined1  [32])local_7a0,auVar53);
  auVar53 = vpaddsw_avx2(local_760,(undefined1  [32])local_740);
  local_740 = (__m256i)vpsubsw_avx2(local_760,(undefined1  [32])local_740);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_700,(undefined1  [32])local_720);
  local_720 = (__m256i)vpsubsw_avx2((undefined1  [32])local_700,(undefined1  [32])local_720);
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_6c0);
  local_6c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_6e0,(undefined1  [32])local_6c0);
  auVar55 = vpaddsw_avx2(local_680,(undefined1  [32])local_6a0);
  local_6a0 = (__m256i)vpsubsw_avx2(local_680,(undefined1  [32])local_6a0);
  _r[1] = uVar74;
  _r[0] = uVar73;
  _r[2] = uVar75;
  _r[3] = lVar76;
  local_7e0 = (__m256i)auVar51;
  local_760 = auVar53;
  local_700 = alVar1;
  local_6e0 = alVar2;
  local_680 = auVar55;
  idct64_stage5_high48_avx2(&local_860,cospi,_r,cos_bit);
  auVar22._8_2_ = 0xb50;
  auVar22._0_8_ = 0xb500b500b500b50;
  auVar22._10_2_ = 0xb50;
  auVar22._12_2_ = 0xb50;
  auVar22._14_2_ = 0xb50;
  auVar22._16_2_ = 0xb50;
  auVar22._18_2_ = 0xb50;
  auVar22._20_2_ = 0xb50;
  auVar22._22_2_ = 0xb50;
  auVar22._24_2_ = 0xb50;
  auVar22._26_2_ = 0xb50;
  auVar22._28_2_ = 0xb50;
  auVar22._30_2_ = 0xb50;
  auVar53 = vpsllw_avx2(auVar22,3);
  local_860 = (__m256i)vpmulhrsw_avx2(auVar53,(undefined1  [32])local_860);
  auVar30._8_2_ = 0x61f;
  auVar30._0_8_ = 0x61f061f061f061f;
  auVar30._10_2_ = 0x61f;
  auVar30._12_2_ = 0x61f;
  auVar30._14_2_ = 0x61f;
  auVar30._16_2_ = 0x61f;
  auVar30._18_2_ = 0x61f;
  auVar30._20_2_ = 0x61f;
  auVar30._22_2_ = 0x61f;
  auVar30._24_2_ = 0x61f;
  auVar30._26_2_ = 0x61f;
  auVar30._28_2_ = 0x61f;
  auVar30._30_2_ = 0x61f;
  auVar53 = vpsllw_avx2(auVar30,3);
  auVar72._8_2_ = 0xec8;
  auVar72._0_8_ = 0xec80ec80ec80ec8;
  auVar72._10_2_ = 0xec8;
  auVar72._12_2_ = 0xec8;
  auVar72._14_2_ = 0xec8;
  auVar72._16_2_ = 0xec8;
  auVar72._18_2_ = 0xec8;
  auVar72._20_2_ = 0xec8;
  auVar72._22_2_ = 0xec8;
  auVar72._24_2_ = 0xec8;
  auVar72._26_2_ = 0xec8;
  auVar72._28_2_ = 0xec8;
  auVar72._30_2_ = 0xec8;
  auVar55 = vpsllw_avx2(auVar72,3);
  auVar51 = vpmulhrsw_avx2((undefined1  [32])local_820,auVar53);
  local_800 = vpmulhrsw_avx2((undefined1  [32])local_820,auVar55);
  auVar53 = vpaddsw_avx2((undefined1  [32])local_7e0,(undefined1  [32])local_7c0);
  local_7c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_7e0,(undefined1  [32])local_7c0);
  auVar55 = vpaddsw_avx2(local_780,(undefined1  [32])local_7a0);
  local_7a0 = (__m256i)vpsubsw_avx2(local_780,(undefined1  [32])local_7a0);
  alVar2[1] = uVar74;
  alVar2[0] = uVar73;
  alVar2[2] = uVar75;
  alVar2[3] = lVar76;
  w1[3] = (longlong)output;
  w1[0] = in_stack_fffffffffffff680._0_8_;
  w1[1] = in_stack_fffffffffffff680._8_8_;
  w1[2] = in_stack_fffffffffffff680._16_8_;
  _r_05[0]._4_4_ = uVar77;
  _r_05[0]._0_4_ = uVar8;
  _r_05[1]._0_4_ = uVar78;
  _r_05[1]._4_4_ = uVar79;
  _r_05[2]._0_4_ = uVar80;
  _r_05[2]._4_4_ = uVar81;
  _r_05[3]._0_4_ = uVar82;
  _r_05[3]._4_4_ = uVar83;
  local_840 = local_860;
  local_820 = (__m256i)auVar51;
  local_7e0 = (__m256i)auVar53;
  local_780 = auVar55;
  btf_16_w16_avx2(alVar2,w1,&local_740,&local_6a0,_r_05,cos_bit_05);
  w0[1] = uVar74;
  w0[0] = uVar73;
  w0[2] = uVar75;
  w0[3] = lVar76;
  w1_00[3] = (longlong)output;
  w1_00[0] = in_stack_fffffffffffff680._0_8_;
  w1_00[1] = in_stack_fffffffffffff680._8_8_;
  w1_00[2] = in_stack_fffffffffffff680._16_8_;
  _r_06[0]._4_4_ = uVar77;
  _r_06[0]._0_4_ = uVar8;
  _r_06[1]._0_4_ = uVar78;
  _r_06[1]._4_4_ = uVar79;
  _r_06[2]._0_4_ = uVar80;
  _r_06[2]._4_4_ = uVar81;
  _r_06[3]._0_4_ = uVar82;
  _r_06[3]._4_4_ = uVar83;
  palVar9 = &local_6c0;
  btf_16_w16_avx2(w0,w1_00,&local_720,&local_6c0,_r_06,cos_bit_06);
  _r_00[1] = uVar74;
  _r_00[0] = uVar73;
  _r_00[2] = uVar75;
  _r_00[3] = lVar76;
  idct64_stage6_high48_avx2(&local_860,(int32_t *)palVar9,_r_00,cos_bit_00);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_860,local_800);
  local_800 = vpsubsw_avx2((undefined1  [32])local_860,local_800);
  auVar53 = vpaddsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_820);
  local_820 = (__m256i)vpsubsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_820);
  palVar9 = &local_7a0;
  w0_00[1] = uVar74;
  w0_00[0] = uVar73;
  w0_00[2] = uVar75;
  w0_00[3] = lVar76;
  w1_01[3] = (longlong)output;
  w1_01[0] = in_stack_fffffffffffff680._0_8_;
  w1_01[1] = in_stack_fffffffffffff680._8_8_;
  w1_01[2] = in_stack_fffffffffffff680._16_8_;
  _r_07[0]._4_4_ = uVar77;
  _r_07[0]._0_4_ = uVar8;
  _r_07[1]._0_4_ = uVar78;
  _r_07[1]._4_4_ = uVar79;
  _r_07[2]._0_4_ = uVar80;
  _r_07[2]._4_4_ = uVar81;
  _r_07[3]._0_4_ = uVar82;
  _r_07[3]._4_4_ = uVar83;
  local_860 = alVar1;
  local_840 = (__m256i)auVar53;
  btf_16_w16_avx2(w0_00,w1_01,&local_7c0,palVar9,_r_07,cos_bit_07);
  auVar53 = vpaddsw_avx2(local_760,(undefined1  [32])local_700);
  local_700 = (__m256i)vpsubsw_avx2(local_760,(undefined1  [32])local_700);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_740,(undefined1  [32])local_720);
  local_720 = (__m256i)vpsubsw_avx2((undefined1  [32])local_740,(undefined1  [32])local_720);
  auVar55 = vpaddsw_avx2(local_680,(undefined1  [32])local_6e0);
  local_6e0 = (__m256i)vpsubsw_avx2(local_680,(undefined1  [32])local_6e0);
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])local_6a0,(undefined1  [32])local_6c0);
  local_6c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_6a0,(undefined1  [32])local_6c0);
  _r_01[1] = uVar74;
  _r_01[0] = uVar73;
  _r_01[2] = uVar75;
  _r_01[3] = lVar76;
  local_760 = auVar53;
  local_740 = alVar1;
  local_6a0 = alVar2;
  local_680 = auVar55;
  idct64_stage7_high48_avx2(&local_860,(int32_t *)palVar9,_r_01,cos_bit_01);
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])local_860,local_780);
  local_780 = vpsubsw_avx2((undefined1  [32])local_860,local_780);
  auVar53 = vpaddsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_7a0);
  local_7a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_840,(undefined1  [32])local_7a0);
  auVar55 = vpaddsw_avx2((undefined1  [32])local_820,(undefined1  [32])local_7c0);
  local_7c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_820,(undefined1  [32])local_7c0);
  auVar51 = vpaddsw_avx2(local_800,(undefined1  [32])local_7e0);
  local_7e0 = (__m256i)vpsubsw_avx2(local_800,(undefined1  [32])local_7e0);
  w0_01[1] = uVar74;
  w0_01[0] = uVar73;
  w0_01[2] = uVar75;
  w0_01[3] = lVar76;
  w1_02[3] = (longlong)output;
  w1_02[0] = in_stack_fffffffffffff680._0_8_;
  w1_02[1] = in_stack_fffffffffffff680._8_8_;
  w1_02[2] = in_stack_fffffffffffff680._16_8_;
  _r_08[0]._4_4_ = uVar77;
  _r_08[0]._0_4_ = uVar8;
  _r_08[1]._0_4_ = uVar78;
  _r_08[1]._4_4_ = uVar79;
  _r_08[2]._0_4_ = uVar80;
  _r_08[2]._4_4_ = uVar81;
  _r_08[3]._0_4_ = uVar82;
  _r_08[3]._4_4_ = uVar83;
  local_860 = alVar1;
  local_840 = (__m256i)auVar53;
  local_820 = (__m256i)auVar55;
  local_800 = auVar51;
  btf_16_w16_avx2(w0_01,w1_02,&local_720,&local_6c0,_r_08,cos_bit_08);
  palVar9 = &local_6e0;
  w0_02[1] = uVar74;
  w0_02[0] = uVar73;
  w0_02[2] = uVar75;
  w0_02[3] = lVar76;
  w1_03[3] = (longlong)output;
  w1_03[0] = in_stack_fffffffffffff680._0_8_;
  w1_03[1] = in_stack_fffffffffffff680._8_8_;
  w1_03[2] = in_stack_fffffffffffff680._16_8_;
  _r_09[0]._4_4_ = uVar77;
  _r_09[0]._0_4_ = uVar8;
  _r_09[1]._0_4_ = uVar78;
  _r_09[1]._4_4_ = uVar79;
  _r_09[2]._0_4_ = uVar80;
  _r_09[2]._4_4_ = uVar81;
  _r_09[3]._0_4_ = uVar82;
  _r_09[3]._4_4_ = uVar83;
  btf_16_w16_avx2(w0_02,w1_03,&local_700,palVar9,_r_09,cos_bit_09);
  _r_02[1] = uVar74;
  _r_02[0] = uVar73;
  _r_02[2] = uVar75;
  _r_02[3] = lVar76;
  idct64_stage8_high48_avx2(&local_860,(int32_t *)palVar9,_r_02,cos_bit_02);
  _r_03[1] = uVar74;
  _r_03[0] = uVar73;
  _r_03[2] = uVar75;
  _r_03[3] = lVar76;
  idct64_stage9_avx2(&local_860,(int32_t *)palVar9,_r_03,cos_bit_03);
  _r_04[1] = uVar74;
  _r_04[0] = uVar73;
  _r_04[2] = uVar75;
  _r_04[3] = lVar76;
  idct64_stage10_avx2(&local_860,(int32_t *)palVar9,_r_04,cos_bit_04);
  idct64_stage11_avx2(output,&local_860);
  return;
}

Assistant:

static void idct64_low32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_w16_0_avx2(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_w16_0_avx2(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_w16_0_avx2(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_w16_0_avx2(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_w16_0_avx2(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_w16_0_avx2(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_avx2(&x[32], &x[33]);
  btf_16_adds_subs_avx2(&x[35], &x[34]);
  btf_16_adds_subs_avx2(&x[36], &x[37]);
  btf_16_adds_subs_avx2(&x[39], &x[38]);
  btf_16_adds_subs_avx2(&x[40], &x[41]);
  btf_16_adds_subs_avx2(&x[43], &x[42]);
  btf_16_adds_subs_avx2(&x[44], &x[45]);
  btf_16_adds_subs_avx2(&x[47], &x[46]);
  btf_16_adds_subs_avx2(&x[48], &x[49]);
  btf_16_adds_subs_avx2(&x[51], &x[50]);
  btf_16_adds_subs_avx2(&x[52], &x[53]);
  btf_16_adds_subs_avx2(&x[55], &x[54]);
  btf_16_adds_subs_avx2(&x[56], &x[57]);
  btf_16_adds_subs_avx2(&x[59], &x[58]);
  btf_16_adds_subs_avx2(&x[60], &x[61]);
  btf_16_adds_subs_avx2(&x[63], &x[62]);

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_avx2(&x[16], &x[17]);
  btf_16_adds_subs_avx2(&x[19], &x[18]);
  btf_16_adds_subs_avx2(&x[20], &x[21]);
  btf_16_adds_subs_avx2(&x[23], &x[22]);
  btf_16_adds_subs_avx2(&x[24], &x[25]);
  btf_16_adds_subs_avx2(&x[27], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[29]);
  btf_16_adds_subs_avx2(&x[31], &x[30]);
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_avx2(&x[8], &x[9]);
  btf_16_adds_subs_avx2(&x[11], &x[10]);
  btf_16_adds_subs_avx2(&x[12], &x[13]);
  btf_16_adds_subs_avx2(&x[15], &x[14]);
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_avx2(&x[4], &x[5]);
  btf_16_adds_subs_avx2(&x[7], &x[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  btf_16_adds_subs_avx2(&x[0], &x[3]);
  btf_16_adds_subs_avx2(&x[1], &x[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 9~11
  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}